

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O3

void __thiscall CMU462::DynamicScene::Mesh::_bevel_selection(Mesh *this,double inset,double shift)

{
  Scene *pSVar1;
  HalfedgeElement *pHVar2;
  XFormWidget *pXVar3;
  long lVar4;
  long lVar5;
  Vector3D local_38;
  
  pSVar1 = (this->super_SceneObject).scene;
  if ((pSVar1 != (Scene *)0x0) &&
     (pHVar2 = (pSVar1->selected).element, pHVar2 != (HalfedgeElement *)0x0)) {
    lVar4 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Vertex::typeinfo);
    lVar5 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Face::typeinfo);
    if (lVar4 == 0) {
      lVar4 = __dynamic_cast(pHVar2,&HalfedgeElement::typeinfo,&Edge::typeinfo);
      if (lVar4 == 0) {
        if (lVar5 == 0) {
          return;
        }
        HalfedgeMesh::_bevel_fc_reposition_with_dist
                  (&this->mesh,&this->beveledFacePos,&this->bevelVertices,shift,inset);
      }
      else {
        HalfedgeMesh::_bevel_edge_reposition_with_dist
                  (&this->mesh,&this->beveledEdgePos,&this->bevelVertices,inset);
      }
    }
    else {
      local_38.x = (this->beveledVertexPos).x;
      local_38.y = (this->beveledVertexPos).y;
      local_38.z = (this->beveledVertexPos).z;
      HalfedgeMesh::_bevel_vtx_reposition_with_dist
                (&this->mesh,&local_38,&this->bevelVertices,inset);
    }
    pSVar1 = (this->super_SceneObject).scene;
    (pSVar1->hovered).coordinates.z = 0.0;
    (pSVar1->hovered).coordinates.x = 0.0;
    (pSVar1->hovered).coordinates.y = 0.0;
    (pSVar1->hovered).object = (SceneObject *)0x0;
    (pSVar1->hovered).element = (HalfedgeElement *)0x0;
    (pSVar1->hovered).axis = None;
    pXVar3 = ((this->super_SceneObject).scene)->elementTransform;
    (pXVar3->target).coordinates.z = 0.0;
    (pXVar3->target).coordinates.x = 0.0;
    (pXVar3->target).coordinates.y = 0.0;
    (pXVar3->target).object = (SceneObject *)0x0;
    (pXVar3->target).element = (HalfedgeElement *)0x0;
    (pXVar3->target).axis = None;
  }
  return;
}

Assistant:

void Mesh::_bevel_selection( double inset, double shift ) {

   if( scene == nullptr ) return;
   HalfedgeElement *element = scene->selected.element;
   if (element == nullptr) return;
   Vertex *v = element->getVertex();
   Edge *e = element->getEdge();
   Face *f = element->getFace();

   if (v != nullptr) {
      mesh._bevel_vtx_reposition_with_dist(beveledVertexPos, bevelVertices, inset);
   } else if (e != nullptr) {
      mesh._bevel_edge_reposition_with_dist(beveledEdgePos, bevelVertices, inset);
   } else if (f != nullptr) {
      mesh._bevel_fc_reposition_with_dist(beveledFacePos, bevelVertices, shift, inset);
   } else {
      return;
   }

   scene->hovered.clear();
   scene->elementTransform->target.clear();
}